

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppModel.h
# Opt level: O0

void __thiscall hiberlite::Column::~Column(Column *this)

{
  Column *this_local;
  
  std::__cxx11::string::~string((string *)&this->storage_type);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

inline Column(std::string _n="", std::string _s="") : name(_n), storage_type(_s) {}